

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  undefined2 local_53;
  undefined1 local_51;
  size_t sStack_50;
  uchar out [3];
  size_t n;
  uchar *puStack_40;
  CURLcode result;
  uchar *host_sep;
  uchar *iptr;
  _Bool left;
  _Bool query_local;
  size_t sStack_28;
  _Bool relative_local;
  size_t len_local;
  char *url_local;
  dynbuf *o_local;
  
  iptr._5_1_ = (query ^ 0xffU) & 1;
  n._4_4_ = CURLE_OK;
  puStack_40 = (uchar *)url;
  sStack_28 = len;
  if (!relative) {
    puStack_40 = (uchar *)find_host_sep(url);
    sStack_50 = (long)puStack_40 - (long)url;
    n._4_4_ = Curl_dyn_addn(o,url,sStack_50);
    sStack_28 = len - sStack_50;
  }
  host_sep = puStack_40;
  for (; sStack_28 != 0 && n._4_4_ == CURLE_OK; sStack_28 = sStack_28 - 1) {
    if (*host_sep == ' ') {
      if (iptr._5_1_ == 0) {
        n._4_4_ = Curl_dyn_addn(o,"+",1);
      }
      else {
        n._4_4_ = Curl_dyn_addn(o,"%20",3);
      }
    }
    else if ((*host_sep < 0x20) || (0x7e < *host_sep)) {
      local_53 = 0x25;
      local_51 = 0;
      Curl_hexbyte((uchar *)((long)&local_53 + 1),*host_sep,true);
      n._4_4_ = Curl_dyn_addn(o,&local_53,3);
    }
    else {
      n._4_4_ = Curl_dyn_addn(o,host_sep,1);
      if (*host_sep == '?') {
        iptr._5_1_ = 0;
      }
    }
    host_sep = host_sep + 1;
  }
  if (n._4_4_ == CURLE_OK) {
    o_local._4_4_ = CURLUE_OK;
  }
  else {
    o_local._4_4_ = CURLUE_OUT_OF_MEMORY;
    if (n._4_4_ == CURLE_TOO_LARGE) {
      o_local._4_4_ = CURLUE_TOO_LARGE;
    }
  }
  return o_local._4_4_;
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result = CURLE_OK;

  if(!relative) {
    size_t n;
    host_sep = (const unsigned char *) find_host_sep(url);

    /* output the first piece as-is */
    n = (const char *)host_sep - url;
    result = Curl_dyn_addn(o, url, n);
    len -= n;
  }

  for(iptr = host_sep; len && !result; iptr++, len--) {
    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
    }
    else if((*iptr < ' ') || (*iptr >= 0x7f)) {
      unsigned char out[3]={'%'};
      Curl_hexbyte(&out[1], *iptr, TRUE);
      result = Curl_dyn_addn(o, out, 3);
    }
    else {
      result = Curl_dyn_addn(o, iptr, 1);
      if(*iptr == '?')
        left = FALSE;
    }
  }

  if(result)
    return cc2cu(result);
  return CURLUE_OK;
}